

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O1

void JSONWorker::NewNode(internalJSONNode *parent,json_string *name,json_string *value,bool param_4)

{
  uint uVar1;
  jsonChildren *this;
  pointer pcVar2;
  internalJSONNode *piVar3;
  JSONNode *pJVar4;
  undefined7 in_register_00000009;
  json_string local_38;
  
  this = parent->Children;
  if (name->_M_string_length == 0) {
    piVar3 = internalJSONNode::newInternal(name,value);
    pJVar4 = JSONNode::newJSONNode(piVar3);
    jsonChildren::inc(this);
    uVar1 = this->mysize;
    this->mysize = uVar1 + 1;
    this->array[uVar1] = pJVar4;
  }
  else {
    pcVar2 = (name->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_38,pcVar2 + 1,pcVar2 + name->_M_string_length,
               CONCAT71(in_register_00000009,param_4));
    piVar3 = internalJSONNode::newInternal(&local_38,value);
    pJVar4 = JSONNode::newJSONNode(piVar3);
    jsonChildren::inc(this);
    uVar1 = this->mysize;
    this->mysize = uVar1 + 1;
    this->array[uVar1] = pJVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void JSONWorker::NewNode(const internalJSONNode * parent, const json_string & name, const json_string & value, ARRAY_PARAM) json_nothrow {
    #ifdef JSON_COMMENTS
	   JSONNode * child;
	   START_MEM_SCOPE
		  json_string _comment;
		  START_MEM_SCOPE
			 const json_char * runner = ((array) ? value.data() : name.data());
			 #ifdef JSON_DEBUG
				const json_char * const end = runner + value.length();
			#endif
			 if (json_unlikely(*runner == JSON_TEMP_COMMENT_IDENTIFIER)){  //multiple comments will be consolidated into one
				size_t count;
				const json_char * start;
			    newcomment:
				count = 0;
				start = runner + 1;
				while(*(++runner) != JSON_TEMP_COMMENT_IDENTIFIER){
				    JSON_ASSERT(runner != end, JSON_TEXT("Removing white space failed"));
					++count;
				}
				if (count) _comment += json_string(start, count);
				if (json_unlikely(*(++runner) == JSON_TEMP_COMMENT_IDENTIFIER)){ //step past the trailing tag
				    _comment += JSON_TEXT('\n');
				    goto newcomment;
				}
			 }
			 internalJSONNode * myinternal;
			 if (array){
				myinternal = internalJSONNode::newInternal(name, runner);
			 } else {
				myinternal = internalJSONNode::newInternal(++runner, value);
			 }
			 child = JSONNode::newJSONNode(myinternal);
		  END_MEM_SCOPE
		  child -> set_comment(_comment);
	   END_MEM_SCOPE
	   const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(child);   //attach it to the parent node
    #else
	if (name.empty()){
	   	const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(name, value)));	    //attach it to the parent node
	} else {
		const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(json_string(name.begin() + 1, name.end()), value)));	    //attach it to the parent node
	}
    #endif
}